

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

HDRImageBuffer * load_exr(char *file_path)

{
  float fVar1;
  uchar *puVar2;
  uchar *puVar3;
  uchar *puVar4;
  pointer pVVar5;
  undefined1 auVar6 [16];
  int iVar7;
  size_t sVar8;
  HDRImageBuffer *this;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  char *err;
  EXRImage exr;
  char *local_1080;
  EXRImage local_1078;
  
  local_1078.num_custom_attributes = 0;
  local_1078.num_channels = 0;
  local_1078.channel_names = (char **)0x0;
  local_1078.images = (uchar **)0x0;
  local_1078.pixel_types = (int *)0x0;
  local_1078.requested_pixel_types = (int *)0x0;
  iVar7 = ParseMultiChannelEXRHeaderFromFile(&local_1078,file_path,&local_1080);
  if (iVar7 == 0) {
    if (0 < local_1078.num_channels) {
      lVar10 = 0;
      do {
        if (local_1078.pixel_types[lVar10] == 1) {
          local_1078.requested_pixel_types[lVar10] = 2;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < local_1078.num_channels);
    }
    iVar7 = LoadMultiChannelEXRFromFile(&local_1078,file_path,&local_1080);
    if (iVar7 != 0) {
      poVar9 = std::operator<<((ostream *)&std::cerr,"[PathTracer] ");
      poVar9 = std::operator<<(poVar9,"Error loading OpenEXR file: ");
      poVar9 = std::operator<<(poVar9,local_1080);
      std::endl<char,std::char_traits<char>>(poVar9);
      exit(1);
    }
    this = (HDRImageBuffer *)operator_new(0x28);
    (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this->w = (long)local_1078.width;
    this->h = (long)local_1078.height;
    std::vector<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>::resize
              (&this->data,(long)local_1078.height * (long)local_1078.width);
    CGL::HDRImageBuffer::clear(this);
    if (local_1078.height != 0 && local_1078.width != 0) {
      puVar2 = local_1078.images[2];
      puVar3 = *local_1078.images;
      puVar4 = local_1078.images[1];
      lVar10 = 0x10;
      uVar11 = 0;
      do {
        fVar1 = *(float *)(puVar3 + uVar11 * 4);
        pVVar5 = (this->data).super__Vector_base<CGL::Vector3D,_std::allocator<CGL::Vector3D>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        auVar6 = vinsertps_avx(ZEXT416(*(uint *)(puVar2 + uVar11 * 4)),
                               ZEXT416(*(uint *)(puVar4 + uVar11 * 4)),0x10);
        auVar6 = vcvtps2pd_avx(auVar6);
        *(undefined1 (*) [16])((long)pVVar5 + lVar10 + -0x10) = auVar6;
        *(double *)((long)&pVVar5->field_0 + lVar10) = (double)fVar1;
        uVar11 = uVar11 + 1;
        lVar10 = lVar10 + 0x20;
      } while (uVar11 < (ulong)((long)local_1078.height * (long)local_1078.width));
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[PathTracer] ",0xd);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error parsing OpenEXR file: ",0x1c);
    if (local_1080 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x389990);
    }
    else {
      sVar8 = strlen(local_1080);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,local_1080,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x70);
    std::ostream::put(-0x70);
    std::ostream::flush();
    this = (HDRImageBuffer *)0x0;
  }
  return this;
}

Assistant:

HDRImageBuffer* load_exr(const char* file_path) {
  
  const char* err;
  
  EXRImage exr;
  InitEXRImage(&exr);

  int ret = ParseMultiChannelEXRHeaderFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error parsing OpenEXR file: " << err);
    return NULL;
  }

  for (int i = 0; i < exr.num_channels; i++) {
    if (exr.pixel_types[i] == TINYEXR_PIXELTYPE_HALF) {
      exr.requested_pixel_types[i] = TINYEXR_PIXELTYPE_FLOAT;
    }
  }

  ret = LoadMultiChannelEXRFromFile(&exr, file_path, &err);
  if (ret != 0) {
    msg("Error loading OpenEXR file: " << err);
    exit(EXIT_FAILURE);
  }

  HDRImageBuffer* envmap = new HDRImageBuffer();
  envmap->resize(exr.width, exr.height);
  float* channel_r = (float*) exr.images[2];
  float* channel_g = (float*) exr.images[1];
  float* channel_b = (float*) exr.images[0];
  for (size_t i = 0; i < exr.width * exr.height; i++) {
    envmap->data[i] = Vector3D(channel_r[i], 
                               channel_g[i], 
                               channel_b[i]);
  }

  return envmap;
}